

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreePrevious(BtCursor *pCur)

{
  uint uVar1;
  MemPage *pMVar2;
  ushort uVar3;
  int iVar4;
  undefined8 in_RSI;
  
  if (pCur->eState != 0) {
    iVar4 = 0;
    if (2 < pCur->eState) {
      iVar4 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar4 != 0) {
      return iVar4;
    }
    if (pCur->eState == '\x01') {
      return 0x65;
    }
    if ((pCur->eState == '\x02') && (pCur->eState = '\0', pCur->skipNext < 0)) {
      return 0;
    }
  }
  pMVar2 = pCur->pPage;
  if ((sqlite3Config.xTestCallback != (_func_int_int *)0x0) &&
     (iVar4 = (*sqlite3Config.xTestCallback)(0x19c), iVar4 != 0)) {
    pMVar2->isInit = '\0';
  }
  if (pMVar2->isInit == '\0') {
    iVar4 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12d5d,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  else {
    uVar3 = pCur->ix;
    if (pMVar2->leaf == '\0') {
      uVar1 = *(uint *)(pMVar2->aData +
                       (CONCAT11(pMVar2->aCellIdx[(ulong)uVar3 * 2],
                                 pMVar2->aCellIdx[(ulong)uVar3 * 2 + 1]) & pMVar2->maskPage));
      iVar4 = moveToChild(pCur,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18);
      if (iVar4 == 0) {
        iVar4 = moveToRightmost(pCur);
        return iVar4;
      }
    }
    else {
      while (uVar3 == 0) {
        if (pCur->iPage == '\0') {
          pCur->eState = '\x01';
          return 0x65;
        }
        moveToParent(pCur);
        uVar3 = pCur->ix;
      }
      pCur->ix = uVar3 - 1;
      iVar4 = 0;
      if ((pCur->pPage->intKey != '\0') && (pCur->pPage->leaf == '\0')) {
        iVar4 = sqlite3BtreePrevious(pCur,(int)in_RSI);
        return iVar4;
      }
    }
  }
  return iVar4;
}

Assistant:

static SQLITE_NOINLINE int btreePrevious(BtCursor *pCur){
  int rc;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & (BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey))==0 );
  assert( pCur->info.nSize==0 );
  if( pCur->eState!=CURSOR_VALID ){
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( CURSOR_SKIPNEXT==pCur->eState ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext<0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  if( sqlite3FaultSim(412) ) pPage->isInit = 0;
  if( !pPage->isInit ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( !pPage->leaf ){
    int idx = pCur->ix;
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ) return rc;
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->ix==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
    }
    assert( pCur->info.nSize==0 );
    assert( (pCur->curFlags & (BTCF_ValidOvfl))==0 );

    pCur->ix--;
    pPage = pCur->pPage;
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, 0);
    }else{
      rc = SQLITE_OK;
    }
  }
  return rc;
}